

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O0

Int32 testing::internal::Int32FromGTestEnv(char *flag,Int32 default_value)

{
  undefined1 uVar1;
  byte bVar2;
  char *name;
  Message *pMVar3;
  String *in_stack_ffffffffffffff50;
  undefined6 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff66;
  undefined1 in_stack_ffffffffffffff67;
  Message local_70;
  String local_68;
  Message local_58;
  Int32 local_4c [2];
  Int32 result;
  char *local_38;
  char *string_value;
  String env_var;
  Int32 default_value_local;
  char *flag_local;
  
  env_var.length_._4_4_ = default_value;
  FlagToEnvVar((internal *)&string_value,flag);
  name = String::c_str((String *)&string_value);
  local_38 = posix::GetEnv(name);
  if (local_38 == (char *)0x0) {
    flag_local._4_4_ = env_var.length_._4_4_;
  }
  else {
    local_4c[0] = env_var.length_._4_4_;
    Message::Message((Message *)
                     CONCAT17(in_stack_ffffffffffffff67,
                              CONCAT16(in_stack_ffffffffffffff66,in_stack_ffffffffffffff60)));
    pMVar3 = Message::operator<<(&local_58,(char (*) [22])"Environment variable ");
    pMVar3 = Message::operator<<(pMVar3,(String *)&string_value);
    uVar1 = ParseInt32(pMVar3,local_38,local_4c);
    bVar2 = uVar1 ^ 0xff;
    Message::~Message((Message *)0x10f219);
    if ((bVar2 & 1) == 0) {
      flag_local._4_4_ = local_4c[0];
    }
    else {
      Message::Message((Message *)CONCAT17(uVar1,CONCAT16(bVar2,in_stack_ffffffffffffff60)));
      Message::operator<<(&local_70,(int *)((long)&env_var.length_ + 4));
      Message::GetString((Message *)&local_68);
      in_stack_ffffffffffffff50 = (String *)String::c_str(&local_68);
      printf("The default value %s is used.\n",in_stack_ffffffffffffff50);
      String::~String(in_stack_ffffffffffffff50);
      Message::~Message((Message *)0x10f296);
      fflush(_stdout);
      flag_local._4_4_ = env_var.length_._4_4_;
    }
  }
  local_4c[1] = 1;
  String::~String(in_stack_ffffffffffffff50);
  return flag_local._4_4_;
}

Assistant:

Int32 Int32FromGTestEnv(const char* flag, Int32 default_value) {
  const String env_var = FlagToEnvVar(flag);
  const char* const string_value = posix::GetEnv(env_var.c_str());
  if (string_value == NULL) {
    // The environment variable is not set.
    return default_value;
  }

  Int32 result = default_value;
  if (!ParseInt32(Message() << "Environment variable " << env_var,
                  string_value, &result)) {
    printf("The default value %s is used.\n",
           (Message() << default_value).GetString().c_str());
    fflush(stdout);
    return default_value;
  }

  return result;
}